

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall
TTD::EventLog::RecordJsRTGetAndClearException
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper)

{
  EventLogEntry *actionEvent;
  JsRTResultOnlyAction *local_20;
  JsRTResultOnlyAction *gcAction;
  
  local_20 = (JsRTResultOnlyAction *)0x0;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTResultOnlyAction,(TTD::NSLogEvents::EventKind)43>
                          (this,&local_20);
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            (actionPopper,actionEvent,&local_20->Result);
  return;
}

Assistant:

void EventLog::RecordJsRTGetAndClearException(TTDJsRTActionResultAutoRecorder& actionPopper)
    {
        NSLogEvents::JsRTResultOnlyAction* gcAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTResultOnlyAction, NSLogEvents::EventKind::GetAndClearExceptionActionTag>(&gcAction);

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(gcAction->Result));
    }